

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O3

bool __thiscall
cmDependsFortran::WriteDependenciesReal
          (cmDependsFortran *this,string *obj,cmFortranSourceInfo *info,string *mod_dir,
          string *stamp_dir,ostream *makeDepends,ostream *internalDepends)

{
  _Rb_tree_node_base *__k;
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  cmLocalGenerator *pcVar3;
  cmMakefile *this_00;
  bool bVar4;
  string *psVar5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  const_iterator cVar8;
  iterator iVar9;
  char *__s;
  size_t sVar10;
  cmFortranSourceInfo *pcVar11;
  string stampFile_1;
  string stampFileForShell;
  string obj_m;
  string binDir;
  string stampFileForMake;
  string obj_i;
  string local_158;
  string local_138;
  string local_118;
  cmFortranSourceInfo *local_f8;
  cmFortranSourceInfo *local_f0;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string *local_68;
  string *local_60;
  _Base_ptr local_58;
  string local_50;
  
  local_68 = stamp_dir;
  local_60 = mod_dir;
  psVar5 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((this->super_cmDepends).LocalGenerator);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar2 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + psVar5->_M_string_length);
  MaybeConvertToRelativePath(&local_50,this,&local_c8,obj);
  cmSystemTools::ConvertToOutputPath(&local_e8,&local_50);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (internalDepends,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(internalDepends," ",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (internalDepends,(info->Source)._M_dataplus._M_p,
                      (info->Source)._M_string_length);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  p_Var7 = (info->Includes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(info->Includes)._M_t._M_impl.super__Rb_tree_header;
  local_f8 = info;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (makeDepends,local_e8._M_dataplus._M_p,local_e8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
      MaybeConvertToRelativePath(&local_138,this,&local_c8,(string *)(p_Var7 + 1));
      cmSystemTools::ConvertToOutputPath(&local_158,&local_138);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,local_158._M_dataplus._M_p,local_158._M_string_length);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p,
                        CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                 local_158.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      std::__ostream_insert<char,std::char_traits<char>>(internalDepends," ",1);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (internalDepends,*(char **)(p_Var7 + 1),(long)p_Var7[1]._M_parent);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  std::ios::widen((char)makeDepends->_vptr_basic_ostream[-3] + (char)makeDepends);
  pcVar11 = local_f8;
  std::ostream::put((char)makeDepends);
  std::ostream::flush();
  p_Var7 = (pcVar11->Requires)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(pcVar11->Requires)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    local_f0 = (cmFortranSourceInfo *)&local_f8->Provides;
    local_58 = &(local_f8->Provides)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      __k = p_Var7 + 1;
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f0,(key_type *)__k);
      if (cVar8._M_node == local_58) {
        iVar9 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&(this->Internal->TargetRequires)._M_t,(key_type *)__k);
        if ((_Rb_tree_header *)iVar9._M_node ==
            &(this->Internal->TargetRequires)._M_t._M_impl.super__Rb_tree_header) {
          abort();
        }
        if (iVar9._M_node[2]._M_parent == (_Base_ptr)0x0) {
          local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
          local_158._M_string_length = 0;
          local_158.field_2._M_local_buf[0] = '\0';
          bVar4 = FindModule(this,(string *)__k,&local_158);
          if (bVar4) {
            MaybeConvertToRelativePath(&local_118,this,&local_c8,&local_158);
            cmSystemTools::ConvertToOutputPath(&local_138,&local_118);
            std::__cxx11::string::operator=((string *)&local_158,(string *)&local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (makeDepends,local_e8._M_dataplus._M_p,local_e8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,local_158._M_dataplus._M_p,local_158._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
          }
        }
        else {
          MaybeConvertToRelativePath(&local_138,this,&local_c8,(string *)(iVar9._M_node + 2));
          cmSystemTools::ConvertToOutputPath(&local_158,&local_138);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (makeDepends,local_e8._M_dataplus._M_p,local_e8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,local_158._M_dataplus._M_p,local_158._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                   local_158.field_2._M_local_buf[0]) + 1);
        }
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  if ((local_f8->Provides)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pcVar11 = (cmFortranSourceInfo *)
              (local_f8->Provides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_f8 = (cmFortranSourceInfo *)&(local_f8->Provides)._M_t._M_impl.super__Rb_tree_header;
    if (pcVar11 != local_f8) {
      do {
        local_f0 = pcVar11;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)this->Internal,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &pcVar11->Provides);
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        pcVar2 = (local_60->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,pcVar2,pcVar2 + local_60->_M_string_length);
        std::__cxx11::string::append((char *)&local_158);
        std::__cxx11::string::_M_append
                  ((char *)&local_158,*(ulong *)&(local_f0->Provides)._M_t._M_impl);
        pcVar3 = (this->super_cmDepends).LocalGenerator;
        MaybeConvertToRelativePath(&local_118,this,&local_c8,&local_158);
        cmOutputConverter::ConvertToOutputFormat
                  (&local_138,&pcVar3->super_cmOutputConverter,&local_118,SHELL);
        std::__cxx11::string::operator=((string *)&local_158,(string *)&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        pcVar2 = (local_68->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_138,pcVar2,pcVar2 + local_68->_M_string_length);
        std::__cxx11::string::append((char *)&local_138);
        std::__cxx11::string::_M_append
                  ((char *)&local_138,*(ulong *)&(local_f0->Provides)._M_t._M_impl);
        std::__cxx11::string::append((char *)&local_138);
        MaybeConvertToRelativePath(&local_118,this,&local_c8,&local_138);
        std::__cxx11::string::operator=((string *)&local_138,(string *)&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        cmOutputConverter::ConvertToOutputFormat
                  (&local_118,&((this->super_cmDepends).LocalGenerator)->super_cmOutputConverter,
                   &local_138,SHELL);
        cmSystemTools::ConvertToOutputPath(&local_a8,&local_138);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (makeDepends,local_e8._M_dataplus._M_p,local_e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,".provides.build",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (makeDepends,local_a8._M_dataplus._M_p,local_a8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar6,local_e8._M_dataplus._M_p,local_e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (makeDepends,"\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod ",0x28);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           (makeDepends,local_158._M_dataplus._M_p,local_158._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6,local_118._M_dataplus._M_p,local_118._M_string_length);
        this_00 = ((this->super_cmDepends).LocalGenerator)->Makefile;
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_88,"CMAKE_Fortran_COMPILER_ID","");
        __s = cmMakefile::GetDefinition(this_00,&local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if ((__s != (char *)0x0) && (*__s != '\0')) {
          std::__ostream_insert<char,std::char_traits<char>>(makeDepends," ",1);
          sVar10 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(makeDepends,__s,sVar10);
        }
        std::__ostream_insert<char,std::char_traits<char>>(makeDepends,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,
                          CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                                   local_158.field_2._M_local_buf[0]) + 1);
        }
        pcVar11 = (cmFortranSourceInfo *)std::_Rb_tree_increment((_Rb_tree_node_base *)local_f0);
      } while (pcVar11 != local_f8);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (makeDepends,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".provides.build:\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (makeDepends,"\t$(CMAKE_COMMAND) -E touch ",0x1b);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (makeDepends,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".provides.build\n",0x10);
    pcVar2 = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
    local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_158,pcVar2,
               pcVar2 + (this->super_cmDepends).TargetDirectory._M_string_length);
    std::__cxx11::string::append((char *)&local_158);
    MaybeConvertToRelativePath(&local_118,this,&local_c8,&local_158);
    cmSystemTools::ConvertToOutputPath(&local_138,&local_118);
    std::__cxx11::string::operator=((string *)&local_158,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (makeDepends,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,".provides.build\n",0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p,
                      CONCAT71(local_158.field_2._M_allocated_capacity._1_7_,
                               local_158.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmDependsFortran::WriteDependenciesReal(std::string const& obj,
                                             cmFortranSourceInfo const& info,
                                             std::string const& mod_dir,
                                             std::string const& stamp_dir,
                                             std::ostream& makeDepends,
                                             std::ostream& internalDepends)
{
  typedef cmDependsFortranInternals::TargetRequiresMap TargetRequiresMap;

  // Get the source file for this object.
  std::string const& src = info.Source;

  // Write the include dependencies to the output stream.
  std::string binDir = this->LocalGenerator->GetBinaryDirectory();
  std::string obj_i = this->MaybeConvertToRelativePath(binDir, obj);
  std::string obj_m = cmSystemTools::ConvertToOutputPath(obj_i);
  internalDepends << obj_i << std::endl;
  internalDepends << " " << src << std::endl;
  for (std::string const& i : info.Includes) {
    makeDepends << obj_m << ": "
                << cmSystemTools::ConvertToOutputPath(
                     this->MaybeConvertToRelativePath(binDir, i))
                << std::endl;
    internalDepends << " " << i << std::endl;
  }
  makeDepends << std::endl;

  // Write module requirements to the output stream.
  for (std::string const& i : info.Requires) {
    // Require only modules not provided in the same source.
    if (info.Provides.find(i) != info.Provides.cend()) {
      continue;
    }

    // The object file should depend on timestamped files for the
    // modules it uses.
    TargetRequiresMap::const_iterator required =
      this->Internal->TargetRequires.find(i);
    if (required == this->Internal->TargetRequires.end()) {
      abort();
    }
    if (!required->second.empty()) {
      // This module is known.  Depend on its timestamp file.
      std::string stampFile = cmSystemTools::ConvertToOutputPath(
        this->MaybeConvertToRelativePath(binDir, required->second));
      makeDepends << obj_m << ": " << stampFile << "\n";
    } else {
      // This module is not known to CMake.  Try to locate it where
      // the compiler will and depend on that.
      std::string module;
      if (this->FindModule(i, module)) {
        module = cmSystemTools::ConvertToOutputPath(
          this->MaybeConvertToRelativePath(binDir, module));
        makeDepends << obj_m << ": " << module << "\n";
      }
    }
  }

  // If any modules are provided then they must be converted to stamp files.
  if (!info.Provides.empty()) {
    // Create a target to copy the module after the object file
    // changes.
    for (std::string const& i : info.Provides) {
      // Include this module in the set provided by this target.
      this->Internal->TargetProvides.insert(i);

      // Always use lower case for the mod stamp file name.  The
      // cmake_copy_f90_mod will call back to this class, which will
      // try various cases for the real mod file name.
      std::string modFile = mod_dir;
      modFile += "/";
      modFile += i;
      modFile = this->LocalGenerator->ConvertToOutputFormat(
        this->MaybeConvertToRelativePath(binDir, modFile),
        cmOutputConverter::SHELL);
      std::string stampFile = stamp_dir;
      stampFile += "/";
      stampFile += i;
      stampFile += ".stamp";
      stampFile = this->MaybeConvertToRelativePath(binDir, stampFile);
      std::string const stampFileForShell =
        this->LocalGenerator->ConvertToOutputFormat(stampFile,
                                                    cmOutputConverter::SHELL);
      std::string const stampFileForMake =
        cmSystemTools::ConvertToOutputPath(stampFile);

      makeDepends << obj_m << ".provides.build"
                  << ": " << stampFileForMake << "\n";
      // Note that when cmake_copy_f90_mod finds that a module file
      // and the corresponding stamp file have no differences, the stamp
      // file is not updated. In such case the stamp file will be always
      // older than its prerequisite and trigger cmake_copy_f90_mod
      // on each new build. This is expected behavior for incremental
      // builds and can not be changed without preforming recursive make
      // calls that would considerably slow down the building process.
      makeDepends << stampFileForMake << ": " << obj_m << "\n";
      makeDepends << "\t$(CMAKE_COMMAND) -E cmake_copy_f90_mod " << modFile
                  << " " << stampFileForShell;
      cmMakefile* mf = this->LocalGenerator->GetMakefile();
      const char* cid = mf->GetDefinition("CMAKE_Fortran_COMPILER_ID");
      if (cid && *cid) {
        makeDepends << " " << cid;
      }
      makeDepends << "\n";
    }
    makeDepends << obj_m << ".provides.build:\n";
    // After copying the modules update the timestamp file.
    makeDepends << "\t$(CMAKE_COMMAND) -E touch " << obj_m
                << ".provides.build\n";

    // Make sure the module timestamp rule is evaluated by the time
    // the target finishes building.
    std::string driver = this->TargetDirectory;
    driver += "/build";
    driver = cmSystemTools::ConvertToOutputPath(
      this->MaybeConvertToRelativePath(binDir, driver));
    makeDepends << driver << ": " << obj_m << ".provides.build\n";
  }

  return true;
}